

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O2

Raw ResizeObject(Heap *heap,Raw object,Size userSize)

{
  Chuck *chuck;
  Size size;
  Raw __dest;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = userSize + 0xb & 0xfffffffffffffff8;
  uVar2 = (ulong)(*(uint *)((long)object + -4) & 0xfffffffe);
  uVar3 = uVar2 * 4;
  size = uVar1 + uVar2 * -4;
  __dest = object;
  if (uVar3 <= uVar1 && size != 0) {
    chuck = (Chuck *)((long)object + -8);
    uVar4 = (ulong)(*(uint *)((long)object + (uVar3 - 4)) >> 1);
    if ((((&((Chuck *)(&chuck->lowerSize + uVar2))->field_0x4)[uVar4 * 8] & 1) == 0) &&
       (uVar1 <= uVar3 + uVar4 * 8)) {
      AllocateInChuck(heap,(Chuck *)(&chuck->lowerSize + uVar2),size);
      uVar1 = (ulong)(*(uint *)((long)object + -4) >> 1);
      SetHigher(chuck,(Chuck *)(&chuck->lowerSize +
                               uVar1 * 2 +
                               (ulong)(*(uint *)((long)object + uVar1 * 8 + -4) >> 1) * 2));
    }
    else {
      __dest = AllocateObject(heap,userSize);
      if (__dest == (Raw)0x0) {
        __dest = (Raw)0x0;
      }
      else {
        memcpy(__dest,object,(ulong)(*(uint *)((long)object + -4) >> 1) * 8 - 4);
        ReleaseObject(heap,object);
      }
    }
  }
  return __dest;
}

Assistant:

Raw ResizeObject(Heap *heap, Raw object, Size userSize) {
    Chuck *chuck = ToChuck(object);
    Size size = (userSize + OVERHEAD_OF_USED_CHUCK + 0x07) >> 3u << 3u;
    if (size <= GetSize(chuck)) {
        return object;
    }
    if (!GetUsed(GetHigher(chuck)) &&
        size <= GetSize(chuck) + GetSize(GetHigher(chuck))) {
        AllocateInChuck(heap, GetHigher(chuck), size - GetSize(chuck));
        SetHigher(chuck, GetHigher(GetHigher(chuck)));
        return object;
    }
    Raw copied = AllocateObject(heap, userSize);
    if (!copied) {
        return NULL;
    }
    memcpy(copied, object, GetSize(chuck) - OVERHEAD_OF_USED_CHUCK);
    ReleaseObject(heap, object);
    return copied;
}